

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O0

string_view slang::nextSegment(string_view *path)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  const_reference pvVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  string_view sVar5;
  size_t i;
  string_view result;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  undefined1 in_stack_ffffffffffffffd0 [16];
  basic_string_view<char,_std::char_traits<char>_> *pbVar7;
  basic_string_view<char,_std::char_traits<char>_> *this;
  string_view sVar6;
  
  pbVar7 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  while( true ) {
    this = pbVar7;
    pbVar1 = (basic_string_view<char,_std::char_traits<char>_> *)
             std::basic_string_view<char,_std::char_traits<char>_>::size(in_RDI);
    if (pbVar1 <= pbVar7) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40);
      in_RDI->_M_len = local_40._M_len;
      in_RDI->_M_str = local_40._M_str;
      sVar5._M_len = in_RDI->_M_len;
      sVar5._M_str = in_RDI->_M_str;
      return sVar5;
    }
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       (in_RDI,(size_type)this);
    if ((*pvVar2 == '/') ||
       (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (in_RDI,(size_type)this), *pvVar2 == '/')) break;
    pbVar7 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&this->_M_len + 1);
  }
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (this,in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_);
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (this,in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_);
  in_RDI->_M_len = bVar4._M_len;
  in_RDI->_M_str = bVar4._M_str;
  sVar6._M_len = bVar3._M_len;
  sVar6._M_str = bVar3._M_str;
  return sVar6;
}

Assistant:

static std::string_view nextSegment(std::string_view& path) {
    for (size_t i = 0; i < path.size(); i++) {
        // NOLINTNEXTLINE
        if (path[i] == fs::path::preferred_separator || path[i] == '/') {
            auto result = path.substr(0, i);
            path = path.substr(i + 1);
            return result;
        }
    }

    auto result = path;
    path = {};
    return result;
}